

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

FilteredOutputGroups *
wallet::GroupOutputs
          (FilteredOutputGroups *__return_storage_ptr__,CWallet *wallet,CoinsResult *coins,
          CoinSelectionParams *coin_sel_params,
          vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *filters,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *ret_discarded_groups)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  COutput *pCVar3;
  _Base_ptr p_Var4;
  pointer pSVar5;
  bool bVar6;
  Chain *pCVar7;
  CAmount CVar8;
  _Base_ptr p_Var9;
  mapped_type *this;
  bool bVar10;
  SelectionFilter *sel_filter;
  COutput *this_00;
  _Base_ptr p_Var11;
  pointer eligibility_filter;
  long in_FS_OFFSET;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *__range4;
  size_t ancestors_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  _Storage<long,_true> local_f8;
  size_t descendants;
  size_t ancestors;
  size_t descendants_1;
  ScriptPubKeyToOutgroup spk_to_positive_groups_map;
  ScriptPubKeyToOutgroup spk_to_groups_map;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (coin_sel_params->m_avoid_partial_spends == false) {
    for (p_Var9 = (coins->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(coins->coins)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      p_Var4 = p_Var9[1]._M_left;
      for (p_Var11 = p_Var9[1]._M_parent; p_Var11 != p_Var4; p_Var11 = p_Var11 + 5) {
        pCVar7 = CWallet::chain(wallet);
        (*pCVar7->_vptr_Chain[0x16])(pCVar7,p_Var11 + 1,&ancestors_1,&descendants_1,0,0);
        spk_to_groups_map._M_t._M_impl._0_8_ = 0;
        spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             CONCAT71(spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_,1
                     );
        spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
             CONCAT44(spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,999);
        std::make_shared<wallet::COutput,wallet::COutput_const&>
                  ((COutput *)&spk_to_positive_groups_map);
        OutputGroup::Insert((OutputGroup *)&spk_to_groups_map,
                            (shared_ptr<wallet::COutput> *)&spk_to_positive_groups_map,ancestors_1,
                            descendants_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header);
        pSVar5 = (filters->
                 super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        bVar10 = false;
        for (eligibility_filter =
                  (filters->
                  super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                  )._M_impl.super__Vector_impl_data._M_start; eligibility_filter != pSVar5;
            eligibility_filter = eligibility_filter + 1) {
          bVar6 = OutputGroup::EligibleForSpending
                            ((OutputGroup *)&spk_to_groups_map,&eligibility_filter->filter);
          if (bVar6) {
            this = std::
                   map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                   ::operator[](__return_storage_ptr__,&eligibility_filter->filter);
            bVar10 = true;
            OutputGroupTypeMap::Push
                      (this,(OutputGroup *)&spk_to_groups_map,p_Var9[1]._M_color,true,true);
          }
        }
        if (!bVar10) {
          std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
          emplace_back<wallet::OutputGroup&>
                    ((vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>> *)
                     ret_discarded_groups,(OutputGroup *)&spk_to_groups_map);
        }
        std::
        vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&spk_to_groups_map);
      }
    }
  }
  else {
    spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header;
    spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_header;
    spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    descendants_1 = (size_t)coin_sel_params;
    spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         spk_to_positive_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         spk_to_groups_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var9 = (coins->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(coins->coins)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      pCVar3 = (COutput *)p_Var9[1]._M_left;
      for (this_00 = (COutput *)p_Var9[1]._M_parent; this_00 != pCVar3; this_00 = this_00 + 1) {
        pCVar7 = CWallet::chain(wallet);
        (*pCVar7->_vptr_Chain[0x16])(pCVar7,&this_00->outpoint,&ancestors,&descendants,0,0);
        std::make_shared<wallet::COutput,wallet::COutput_const&>((COutput *)&ancestors_1);
        CVar8 = COutput::GetEffectiveValue(this_00);
        if (0 < CVar8) {
          GroupOutputs::anon_class_8_1_35acf559::operator()
                    ((anon_class_8_1_35acf559 *)&descendants_1,
                     (shared_ptr<wallet::COutput> *)&ancestors_1,p_Var9[1]._M_color,ancestors,
                     descendants,&spk_to_positive_groups_map);
        }
        GroupOutputs::anon_class_8_1_35acf559::operator()
                  ((anon_class_8_1_35acf559 *)&descendants_1,
                   (shared_ptr<wallet::COutput> *)&ancestors_1,p_Var9[1]._M_color,ancestors,
                   descendants,&spk_to_groups_map);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
      }
    }
    ancestors_1 = (size_t)filters;
    local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    local_f8 = (_Storage<long,_true>)ret_discarded_groups;
    GroupOutputs::anon_class_24_3_ac95488a::operator()
              ((anon_class_24_3_ac95488a *)&ancestors_1,&spk_to_groups_map,false);
    GroupOutputs::anon_class_24_3_ac95488a::operator()
              ((anon_class_24_3_ac95488a *)&ancestors_1,&spk_to_positive_groups_map,true);
    std::
    _Rb_tree<std::pair<CScript,_OutputType>,_std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>,_std::_Select1st<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>,_std::less<std::pair<CScript,_OutputType>_>,_std::allocator<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>_>
    ::~_Rb_tree(&spk_to_positive_groups_map._M_t);
    std::
    _Rb_tree<std::pair<CScript,_OutputType>,_std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>,_std::_Select1st<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>,_std::less<std::pair<CScript,_OutputType>_>,_std::allocator<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>_>
    ::~_Rb_tree(&spk_to_groups_map._M_t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

FilteredOutputGroups GroupOutputs(const CWallet& wallet,
                          const CoinsResult& coins,
                          const CoinSelectionParams& coin_sel_params,
                          const std::vector<SelectionFilter>& filters,
                          std::vector<OutputGroup>& ret_discarded_groups)
{
    FilteredOutputGroups filtered_groups;

    if (!coin_sel_params.m_avoid_partial_spends) {
        // Allowing partial spends means no grouping. Each COutput gets its own OutputGroup
        for (const auto& [type, outputs] : coins.coins) {
            for (const COutput& output : outputs) {
                // Get mempool info
                size_t ancestors, descendants;
                wallet.chain().getTransactionAncestry(output.outpoint.hash, ancestors, descendants);

                // Create a new group per output and add it to the all groups vector
                OutputGroup group(coin_sel_params);
                group.Insert(std::make_shared<COutput>(output), ancestors, descendants);

                // Each filter maps to a different set of groups
                bool accepted = false;
                for (const auto& sel_filter : filters) {
                    const auto& filter = sel_filter.filter;
                    if (!group.EligibleForSpending(filter)) continue;
                    filtered_groups[filter].Push(group, type, /*insert_positive=*/true, /*insert_mixed=*/true);
                    accepted = true;
                }
                if (!accepted) ret_discarded_groups.emplace_back(group);
            }
        }
        return filtered_groups;
    }

    // We want to combine COutputs that have the same scriptPubKey into single OutputGroups
    // except when there are more than OUTPUT_GROUP_MAX_ENTRIES COutputs grouped in an OutputGroup.
    // To do this, we maintain a map where the key is the scriptPubKey and the value is a vector of OutputGroups.
    // For each COutput, we check if the scriptPubKey is in the map, and if it is, the COutput is added
    // to the last OutputGroup in the vector for the scriptPubKey. When the last OutputGroup has
    // OUTPUT_GROUP_MAX_ENTRIES COutputs, a new OutputGroup is added to the end of the vector.
    typedef std::map<std::pair<CScript, OutputType>, std::vector<OutputGroup>> ScriptPubKeyToOutgroup;
    const auto& insert_output = [&](
            const std::shared_ptr<COutput>& output, OutputType type, size_t ancestors, size_t descendants,
            ScriptPubKeyToOutgroup& groups_map) {
        std::vector<OutputGroup>& groups = groups_map[std::make_pair(output->txout.scriptPubKey,type)];

        if (groups.size() == 0) {
            // No OutputGroups for this scriptPubKey yet, add one
            groups.emplace_back(coin_sel_params);
        }

        // Get the last OutputGroup in the vector so that we can add the COutput to it
        // A pointer is used here so that group can be reassigned later if it is full.
        OutputGroup* group = &groups.back();

        // Check if this OutputGroup is full. We limit to OUTPUT_GROUP_MAX_ENTRIES when using -avoidpartialspends
        // to avoid surprising users with very high fees.
        if (group->m_outputs.size() >= OUTPUT_GROUP_MAX_ENTRIES) {
            // The last output group is full, add a new group to the vector and use that group for the insertion
            groups.emplace_back(coin_sel_params);
            group = &groups.back();
        }

        group->Insert(output, ancestors, descendants);
    };

    ScriptPubKeyToOutgroup spk_to_groups_map;
    ScriptPubKeyToOutgroup spk_to_positive_groups_map;
    for (const auto& [type, outs] : coins.coins) {
        for (const COutput& output : outs) {
            size_t ancestors, descendants;
            wallet.chain().getTransactionAncestry(output.outpoint.hash, ancestors, descendants);

            const auto& shared_output = std::make_shared<COutput>(output);
            // Filter for positive only before adding the output
            if (output.GetEffectiveValue() > 0) {
                insert_output(shared_output, type, ancestors, descendants, spk_to_positive_groups_map);
            }

            // 'All' groups
            insert_output(shared_output, type, ancestors, descendants, spk_to_groups_map);
        }
    }

    // Now we go through the entire maps and pull out the OutputGroups
    const auto& push_output_groups = [&](const ScriptPubKeyToOutgroup& groups_map, bool positive_only) {
        for (const auto& [script, groups] : groups_map) {
            // Go through the vector backwards. This allows for the first item we deal with being the partial group.
            for (auto group_it = groups.rbegin(); group_it != groups.rend(); group_it++) {
                const OutputGroup& group = *group_it;

                // Each filter maps to a different set of groups
                bool accepted = false;
                for (const auto& sel_filter : filters) {
                    const auto& filter = sel_filter.filter;
                    if (!group.EligibleForSpending(filter)) continue;

                    // Don't include partial groups if there are full groups too and we don't want partial groups
                    if (group_it == groups.rbegin() && groups.size() > 1 && !filter.m_include_partial_groups) {
                        continue;
                    }

                    OutputType type = script.second;
                    // Either insert the group into the positive-only groups or the mixed ones.
                    filtered_groups[filter].Push(group, type, positive_only, /*insert_mixed=*/!positive_only);
                    accepted = true;
                }
                if (!accepted) ret_discarded_groups.emplace_back(group);
            }
        }
    };

    push_output_groups(spk_to_groups_map, /*positive_only=*/ false);
    push_output_groups(spk_to_positive_groups_map, /*positive_only=*/ true);

    return filtered_groups;
}